

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O2

void CreateBackwardReferencesNH40
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint16_t *puVar7;
  BrotliDictionary *pBVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  ushort uVar17;
  short sVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint8_t *puVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  uint32_t uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint8_t uVar33;
  uint uVar34;
  uint16_t uVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ushort uVar49;
  long lVar50;
  bool bVar51;
  ulong local_160;
  ulong local_150;
  ulong local_140;
  size_t local_120;
  ulong local_108;
  ulong local_f8;
  ulong local_e8;
  ulong local_c0;
  Command_conflict *local_b8;
  int local_9c;
  
  uVar11 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar4 = (position - 3) + num_bytes;
  sVar19 = position;
  if (3 < num_bytes) {
    sVar19 = uVar4;
  }
  lVar20 = 0x200;
  if (params->quality < 9) {
    lVar20 = 0x40;
  }
  uVar1 = position + num_bytes;
  uVar5 = (position - 4) + num_bytes;
  lVar3 = position - 1;
  local_120 = *last_insert_len;
  uVar41 = lVar20 + position;
  local_b8 = commands;
LAB_00111a9f:
LAB_00111aad:
  uVar14 = position;
  if (uVar1 <= uVar14 + 4) {
    *last_insert_len = (local_120 + uVar1) - uVar14;
    *num_commands = *num_commands + ((long)local_b8 - (long)commands >> 4);
    return;
  }
  local_c0 = uVar1 - uVar14;
  uVar31 = uVar11;
  if (uVar14 < uVar11) {
    uVar31 = uVar14;
  }
  uVar38 = (params->dist).max_distance;
  uVar29 = uVar14 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar29);
  uVar34 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> 0x11;
  uVar42 = (ulong)((uint)local_c0 & 7);
  uVar44 = 0x7e4;
  uVar45 = 0;
  uVar32 = 0;
  lVar50 = 0;
  local_160 = 0;
  do {
    uVar33 = (uint8_t)uVar34;
    if (lVar50 == 4) {
      uVar15 = (ulong)uVar34;
      lVar50 = *(long *)(hasher + 0x80030);
      uVar46 = uVar14 - *(uint *)(hasher + uVar15 * 4 + 0x28);
      uVar6 = *(ushort *)(hasher + uVar15 * 2 + 0x20028);
      uVar36 = 0;
      uVar21 = uVar46;
      lVar12 = lVar50;
      uVar17 = uVar6;
      uVar30 = local_160;
      do {
        local_160 = uVar30;
        uVar22 = uVar44;
        local_108 = uVar45;
        uVar47 = uVar32;
        do {
          do {
            do {
              do {
                bVar51 = lVar12 == 0;
                lVar12 = lVar12 + -1;
                if ((bVar51) || (uVar36 = uVar36 + uVar21, uVar31 < uVar36)) {
                  uVar17 = *(ushort *)(hasher + 0x80028);
                  *(ushort *)(hasher + 0x80028) = uVar17 + 1;
                  hasher[(uVar14 & 0xffff) + 0x30028] = uVar33;
                  if (0xfffe < uVar46) {
                    uVar46 = 0xffff;
                  }
                  *(short *)(hasher + (ulong)uVar17 * 4 + 0x40028) = (short)uVar46;
                  *(ushort *)(hasher + (ulong)uVar17 * 4 + 0x4002a) = uVar6;
                  *(int *)(hasher + uVar15 * 4 + 0x28) = (int)uVar14;
                  *(ushort *)(hasher + uVar15 * 2 + 0x20028) = uVar17;
                  if (uVar22 != 0x7e4) {
                    iVar25 = 0;
                    goto LAB_0011209b;
                  }
                  uVar32 = *(ulong *)(hasher + 0x18);
                  local_e8 = *(ulong *)(hasher + 0x20);
                  if (local_e8 < uVar32 >> 7) goto LAB_001120a8;
                  uVar45 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar7 = (params->dictionary).hash_table;
                  iVar25 = 0;
                  uVar22 = 0x7e4;
                  lVar12 = 0;
                  goto LAB_00111eba;
                }
                uVar32 = (ulong)uVar17;
                uVar17 = *(ushort *)(hasher + uVar32 * 4 + 0x4002a);
                uVar21 = (ulong)*(ushort *)(hasher + uVar32 * 4 + 0x40028);
              } while (ringbuffer_mask < uVar29 + local_160);
              uVar45 = uVar14 - uVar36 & ringbuffer_mask;
            } while ((ringbuffer_mask < uVar45 + local_160) ||
                    (ringbuffer[uVar29 + local_160] != ringbuffer[uVar45 + local_160]));
            uVar32 = 0;
            lVar13 = 0;
LAB_00111d16:
            uVar44 = uVar42;
            uVar30 = local_c0 & 0xfffffffffffffff8;
            if (local_c0 >> 3 == uVar32) {
              for (; (uVar32 = local_c0, uVar44 != 0 &&
                     (uVar32 = uVar30,
                     ringbuffer[uVar30 + uVar45] == *(uint8_t *)((long)piVar2 + uVar30)));
                  uVar30 = uVar30 + 1) {
                uVar44 = uVar44 - 1;
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar32 * 2) == *(ulong *)(ringbuffer + uVar32 * 8 + uVar45))
              goto code_r0x00111d36;
              uVar45 = *(ulong *)(ringbuffer + uVar32 * 8 + uVar45) ^
                       *(ulong *)(piVar2 + uVar32 * 2);
              uVar32 = 0;
              if (uVar45 != 0) {
                for (; (uVar45 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar32 = (uVar32 >> 3 & 0x1fffffff) - lVar13;
            }
          } while (uVar32 < 4);
          iVar25 = 0x1f;
          if ((uint)uVar36 != 0) {
            for (; (uint)uVar36 >> iVar25 == 0; iVar25 = iVar25 + -1) {
            }
          }
          uVar44 = (ulong)(iVar25 * -0x1e + 0x780) + uVar32 * 0x87;
          uVar45 = uVar36;
          uVar30 = uVar32;
        } while (uVar44 <= uVar22);
      } while( true );
    }
    uVar30 = (ulong)dist_cache[lVar50];
    uVar21 = uVar14 - uVar30;
    if ((((lVar50 == 0) || (hasher[(uVar21 & 0xffff) + 0x30028] == uVar33)) && (uVar30 <= uVar31))
       && (uVar21 < uVar14)) {
      uVar36 = 0;
      lVar12 = 0;
LAB_00111b89:
      uVar46 = uVar42;
      uVar15 = local_c0 & 0xfffffffffffffff8;
      if (local_c0 >> 3 == uVar36) {
        for (; (uVar36 = local_c0, uVar46 != 0 &&
               (uVar36 = uVar15,
               ringbuffer[uVar15 + (uVar21 & ringbuffer_mask)] ==
               *(uint8_t *)((long)piVar2 + uVar15))); uVar15 = uVar15 + 1) {
          uVar46 = uVar46 - 1;
        }
      }
      else {
        if (*(ulong *)(piVar2 + uVar36 * 2) ==
            *(ulong *)(ringbuffer + uVar36 * 8 + (uVar21 & ringbuffer_mask))) goto code_r0x00111ba6;
        uVar36 = *(ulong *)(ringbuffer + uVar36 * 8 + (uVar21 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar36 * 2);
        uVar21 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar36 = (uVar21 >> 3 & 0x1fffffff) - lVar12;
      }
      if ((1 < uVar36) && (uVar21 = uVar36 * 0x87 + 0x78f, uVar44 < uVar21)) {
        if (lVar50 != 0) {
          uVar21 = uVar21 - ((0x1ca10U >> ((byte)lVar50 & 2) & 4) + 0x27);
        }
        if (uVar44 < uVar21) {
          uVar32 = uVar36;
          uVar45 = uVar30;
          uVar44 = uVar21;
          local_160 = uVar36;
        }
      }
    }
    lVar50 = lVar50 + 1;
  } while( true );
LAB_00111eba:
  if (lVar12 == 2) goto LAB_0011209b;
  uVar6 = puVar7[uVar45];
  uVar32 = uVar32 + 1;
  *(ulong *)(hasher + 0x18) = uVar32;
  if (uVar6 != 0) {
    uVar34 = uVar6 & 0x1f;
    uVar44 = (ulong)uVar34;
    if (uVar44 <= local_c0) {
      pBVar8 = (params->dictionary).words;
      lVar13 = (ulong)pBVar8->offsets_by_length[uVar44] + uVar44 * (uVar6 >> 5);
      uVar43 = (uint)uVar6;
      uVar29 = (ulong)(uVar43 & 0x18);
      uVar42 = 0;
LAB_00111f2a:
      if ((uVar6 & 0x18) == uVar42) {
        uVar21 = (ulong)(uVar43 & 7);
        puVar23 = pBVar8->data + uVar42 + lVar13;
        for (; (bVar51 = uVar21 != 0, uVar21 = uVar21 - 1, uVar42 = (ulong)(uVar43 & 0x1f), bVar51
               && (uVar42 = uVar29, *(uint8_t *)((long)piVar2 + uVar29) == *puVar23));
            uVar29 = uVar29 + 1) {
          puVar23 = puVar23 + 1;
        }
      }
      else {
        uVar21 = *(ulong *)(pBVar8->data + uVar42 + lVar13);
        if (uVar21 == *(ulong *)((long)piVar2 + uVar42)) goto code_r0x00111f45;
        uVar21 = *(ulong *)((long)piVar2 + uVar42) ^ uVar21;
        uVar29 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar42 = (uVar29 >> 3 & 0x1fffffff) + uVar42;
      }
      if (((uVar42 != 0) && (uVar44 < (params->dictionary).cutoffTransformsCount + uVar42)) &&
         (uVar44 = (ulong)(uVar6 >> 5) + uVar31 + 1 +
                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar44 - uVar42) * '\x06' & 0x3fU)) & 0x3f) +
                    (uVar44 - uVar42) * 4 << (pBVar8->size_bits_by_length[uVar44] & 0x3f)),
         uVar44 <= uVar38)) {
        iVar26 = 0x1f;
        if ((uint)uVar44 != 0) {
          for (; (uint)uVar44 >> iVar26 == 0; iVar26 = iVar26 + -1) {
          }
        }
        uVar29 = (uVar42 * 0x87 - (ulong)(uint)(iVar26 * 0x1e)) + 0x780;
        if (uVar22 <= uVar29) {
          iVar25 = uVar34 - (int)uVar42;
          local_e8 = local_e8 + 1;
          *(ulong *)(hasher + 0x20) = local_e8;
          uVar22 = uVar29;
          local_108 = uVar44;
          uVar47 = uVar42;
        }
      }
    }
  }
  lVar12 = lVar12 + 1;
  uVar45 = uVar45 + 1;
  goto LAB_00111eba;
LAB_0011209b:
  if (uVar22 < 0x7e5) {
LAB_001120a8:
    local_120 = local_120 + 1;
    position = uVar14 + 1;
    if (uVar41 < position) {
      if (uVar41 + (uint)((int)lVar20 * 4) < position) {
        uVar31 = uVar14 + 0x11;
        if (uVar5 <= uVar14 + 0x11) {
          uVar31 = uVar5;
        }
        sVar18 = uVar17 + 2;
        for (; uVar6 = sVar18 - 1, position < uVar31; position = position + 4) {
          uVar34 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar38 = (ulong)uVar34;
          *(short *)(hasher + 0x80028) = sVar18;
          uVar14 = position - *(uint *)(hasher + uVar38 * 4 + 0x28);
          hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar34;
          if (0xfffe < uVar14) {
            uVar14 = 0xffff;
          }
          *(short *)(hasher + (ulong)uVar6 * 4 + 0x40028) = (short)uVar14;
          *(undefined2 *)(hasher + (ulong)uVar6 * 4 + 0x4002a) =
               *(undefined2 *)(hasher + uVar38 * 2 + 0x20028);
          *(int *)(hasher + uVar38 * 4 + 0x28) = (int)position;
          *(ushort *)(hasher + uVar38 * 2 + 0x20028) = uVar6;
          local_120 = local_120 + 4;
          sVar18 = sVar18 + 1;
        }
      }
      else {
        uVar31 = uVar14 + 9;
        if (uVar4 <= uVar14 + 9) {
          uVar31 = uVar4;
        }
        sVar18 = uVar17 + 2;
        for (; uVar6 = sVar18 - 1, position < uVar31; position = position + 2) {
          uVar34 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar38 = (ulong)uVar34;
          *(short *)(hasher + 0x80028) = sVar18;
          uVar14 = position - *(uint *)(hasher + uVar38 * 4 + 0x28);
          hasher[(position & 0xffff) + 0x30028] = (uint8_t)uVar34;
          if (0xfffe < uVar14) {
            uVar14 = 0xffff;
          }
          *(short *)(hasher + (ulong)uVar6 * 4 + 0x40028) = (short)uVar14;
          *(undefined2 *)(hasher + (ulong)uVar6 * 4 + 0x4002a) =
               *(undefined2 *)(hasher + uVar38 * 2 + 0x20028);
          *(int *)(hasher + uVar38 * 4 + 0x28) = (int)position;
          *(ushort *)(hasher + uVar38 * 2 + 0x20028) = uVar6;
          local_120 = local_120 + 2;
          sVar18 = sVar18 + 1;
        }
      }
    }
    goto LAB_00111aad;
  }
  uVar41 = local_120 + 4;
  uVar31 = (lVar3 + num_bytes) - uVar14;
  local_9c = 0;
  local_e8 = uVar22;
  uVar6 = uVar17 + 1;
LAB_00112249:
  uVar32 = (ulong)((uint)uVar31 & 7);
  local_c0 = local_c0 - 1;
  uVar38 = uVar47 - 1;
  if (local_c0 <= uVar47 - 1) {
    uVar38 = local_c0;
  }
  if (4 < params->quality) {
    uVar38 = 0;
  }
  uVar45 = uVar14 + 1;
  local_150 = uVar11;
  if (uVar45 < uVar11) {
    local_150 = uVar45;
  }
  uVar44 = (params->dist).max_distance;
  uVar21 = uVar45 & ringbuffer_mask;
  piVar2 = (int *)(ringbuffer + uVar21);
  uVar34 = (uint)(*(int *)(ringbuffer + uVar21) * 0x1e35a7bd) >> 0x11;
  uVar42 = 0x7e4;
  uVar29 = 0;
  local_140 = 0;
  lVar12 = 0;
  do {
    uVar33 = (uint8_t)uVar34;
    if (lVar12 == 4) {
      uVar46 = (ulong)uVar34;
      uVar15 = uVar45 - *(uint *)(hasher + uVar46 * 4 + 0x28);
      uVar17 = *(ushort *)(hasher + uVar46 * 2 + 0x20028);
      uVar36 = 0;
      uVar30 = uVar15;
      lVar12 = lVar50;
      uVar49 = uVar17;
      do {
        uVar48 = local_140;
        uVar40 = uVar29;
        uVar39 = uVar38;
        uVar22 = uVar42;
        uVar24 = uVar21 + uVar39;
        do {
          do {
            do {
              do {
                bVar51 = lVar12 == 0;
                lVar12 = lVar12 + -1;
                if ((bVar51) || (uVar36 = uVar36 + uVar30, local_150 < uVar36)) {
                  *(ushort *)(hasher + 0x80028) = uVar6 + 1;
                  if (0xfffe < uVar15) {
                    uVar15 = 0xffff;
                  }
                  hasher[(uVar45 & 0xffff) + 0x30028] = uVar33;
                  *(short *)(hasher + (ulong)uVar6 * 4 + 0x40028) = (short)uVar15;
                  *(ushort *)(hasher + (ulong)uVar6 * 4 + 0x4002a) = uVar17;
                  *(int *)(hasher + uVar46 * 4 + 0x28) = (int)uVar45;
                  *(ushort *)(hasher + uVar46 * 2 + 0x20028) = uVar6;
                  iVar26 = 0;
                  if (uVar22 != 0x7e4) goto LAB_00112835;
                  uVar38 = *(ulong *)(hasher + 0x18);
                  local_f8 = *(ulong *)(hasher + 0x20);
                  uVar22 = 0x7e4;
                  if (local_f8 < uVar38 >> 7) goto LAB_00112835;
                  uVar32 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                  puVar7 = (params->dictionary).hash_table;
                  iVar26 = 0;
                  lVar12 = 0;
                  goto LAB_00112641;
                }
                uVar38 = (ulong)uVar49;
                uVar49 = *(ushort *)(hasher + uVar38 * 4 + 0x4002a);
                uVar30 = (ulong)*(ushort *)(hasher + uVar38 * 4 + 0x40028);
              } while (ringbuffer_mask < uVar24);
              uVar42 = uVar45 - uVar36 & ringbuffer_mask;
              uVar38 = uVar42 + uVar39;
            } while ((ringbuffer_mask < uVar38) || (ringbuffer[uVar24] != ringbuffer[uVar38]));
            uVar38 = 0;
            lVar13 = 0;
LAB_00112494:
            if (uVar31 >> 3 == uVar38) {
              uVar29 = uVar32;
              for (uVar38 = -lVar13;
                  (bVar51 = uVar29 != 0, uVar29 = uVar29 - 1, bVar51 &&
                  (ringbuffer[uVar38 + uVar42] == *(uint8_t *)((long)piVar2 + uVar38)));
                  uVar38 = uVar38 + 1) {
              }
            }
            else {
              if (*(ulong *)(piVar2 + uVar38 * 2) == *(ulong *)(ringbuffer + uVar38 * 8 + uVar42))
              goto code_r0x001124ad;
              uVar42 = *(ulong *)(ringbuffer + uVar38 * 8 + uVar42) ^
                       *(ulong *)(piVar2 + uVar38 * 2);
              uVar38 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar38 = (uVar38 >> 3 & 0x1fffffff) - lVar13;
            }
          } while (uVar38 < 4);
          iVar26 = 0x1f;
          if ((uint)uVar36 != 0) {
            for (; (uint)uVar36 >> iVar26 == 0; iVar26 = iVar26 + -1) {
            }
          }
          uVar42 = (ulong)(iVar26 * -0x1e + 0x780) + uVar38 * 0x87;
          uVar29 = uVar36;
          local_140 = uVar38;
        } while (uVar42 <= uVar22);
      } while( true );
    }
    uVar36 = (ulong)dist_cache[lVar12];
    uVar30 = uVar45 - uVar36;
    if ((((lVar12 == 0) || (hasher[(uVar30 & 0xffff) + 0x30028] == uVar33)) && (uVar36 <= local_150)
        ) && (uVar30 < uVar45)) {
      uVar46 = 0;
      lVar13 = 0;
LAB_00112339:
      if (uVar31 >> 3 == uVar46) {
        uVar15 = uVar32;
        for (uVar46 = -lVar13;
            (bVar51 = uVar15 != 0, uVar15 = uVar15 - 1, bVar51 &&
            (ringbuffer[uVar46 + (uVar30 & ringbuffer_mask)] == *(uint8_t *)((long)piVar2 + uVar46))
            ); uVar46 = uVar46 + 1) {
        }
      }
      else {
        if (*(ulong *)(piVar2 + uVar46 * 2) ==
            *(ulong *)(ringbuffer + uVar46 * 8 + (uVar30 & ringbuffer_mask))) goto code_r0x00112352;
        uVar46 = *(ulong *)(ringbuffer + uVar46 * 8 + (uVar30 & ringbuffer_mask)) ^
                 *(ulong *)(piVar2 + uVar46 * 2);
        uVar30 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        uVar46 = (uVar30 >> 3 & 0x1fffffff) - lVar13;
      }
      if ((1 < uVar46) && (uVar30 = uVar46 * 0x87 + 0x78f, uVar42 < uVar30)) {
        if (lVar12 != 0) {
          uVar30 = uVar30 - ((0x1ca10U >> ((byte)lVar12 & 2) & 4) + 0x27);
        }
        if (uVar42 < uVar30) {
          uVar42 = uVar30;
          uVar38 = uVar46;
          uVar29 = uVar36;
          local_140 = uVar46;
        }
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
LAB_00112641:
  if (lVar12 == 2) goto LAB_00112835;
  uVar17 = puVar7[uVar32];
  uVar38 = uVar38 + 1;
  *(ulong *)(hasher + 0x18) = uVar38;
  if (uVar17 != 0) {
    uVar34 = uVar17 & 0x1f;
    uVar42 = (ulong)uVar34;
    if (uVar42 <= local_c0) {
      pBVar8 = (params->dictionary).words;
      lVar13 = (ulong)pBVar8->offsets_by_length[uVar42] + uVar42 * (uVar17 >> 5);
      uVar29 = (ulong)(uVar17 & 0x18);
      uVar21 = 0;
LAB_001126c1:
      if ((uVar17 & 0x18) == uVar21) {
        uVar30 = (ulong)(uVar17 & 7);
        puVar23 = pBVar8->data + uVar21 + lVar13;
        for (; (bVar51 = uVar30 != 0, uVar30 = uVar30 - 1, uVar21 = (ulong)(uVar17 & 0x1f), bVar51
               && (uVar21 = uVar29, *(uint8_t *)((long)piVar2 + uVar29) == *puVar23));
            uVar29 = uVar29 + 1) {
          puVar23 = puVar23 + 1;
        }
      }
      else {
        uVar30 = *(ulong *)(pBVar8->data + uVar21 + lVar13);
        if (uVar30 == *(ulong *)((long)piVar2 + uVar21)) goto code_r0x001126dc;
        uVar30 = *(ulong *)((long)piVar2 + uVar21) ^ uVar30;
        uVar29 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
          }
        }
        uVar21 = (uVar29 >> 3 & 0x1fffffff) + uVar21;
      }
      if (((uVar21 != 0) && (uVar42 < (params->dictionary).cutoffTransformsCount + uVar21)) &&
         (uVar42 = (ulong)(uVar17 >> 5) + local_150 + 1 +
                   ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                                  ((char)(uVar42 - uVar21) * '\x06' & 0x3fU)) & 0x3f) +
                    (uVar42 - uVar21) * 4 << (pBVar8->size_bits_by_length[uVar42] & 0x3f)),
         uVar42 <= uVar44)) {
        iVar9 = 0x1f;
        if ((uint)uVar42 != 0) {
          for (; (uint)uVar42 >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        uVar29 = (uVar21 * 0x87 - (ulong)(uint)(iVar9 * 0x1e)) + 0x780;
        if (uVar22 <= uVar29) {
          iVar26 = uVar34 - (int)uVar21;
          local_f8 = local_f8 + 1;
          *(ulong *)(hasher + 0x20) = local_f8;
          uVar22 = uVar29;
          uVar40 = uVar42;
          uVar48 = uVar21;
        }
      }
    }
  }
  lVar12 = lVar12 + 1;
  uVar32 = uVar32 + 1;
  goto LAB_00112641;
code_r0x001126dc:
  uVar21 = uVar21 + 8;
  goto LAB_001126c1;
LAB_00112835:
  if (uVar22 < local_e8 + 0xaf) {
    uVar45 = uVar14;
    uVar40 = local_108;
    uVar48 = uVar47;
    iVar26 = iVar25;
    local_150 = uVar11;
    sVar10 = local_120;
    if (uVar14 < uVar11) {
      local_150 = uVar14;
    }
    goto LAB_001128c4;
  }
  sVar10 = uVar41;
  if (local_9c == 3) goto LAB_001128c4;
  local_120 = local_120 + 1;
  local_9c = local_9c + 1;
  uVar38 = uVar14 + 5;
  uVar31 = uVar31 - 1;
  uVar14 = uVar45;
  uVar47 = uVar48;
  sVar10 = local_120;
  local_108 = uVar40;
  local_e8 = uVar22;
  uVar6 = uVar6 + 1;
  iVar25 = iVar26;
  if (uVar1 <= uVar38) goto LAB_001128c4;
  goto LAB_00112249;
LAB_001128c4:
  local_120 = sVar10;
  if (local_150 < uVar40) {
LAB_001128ce:
    uVar41 = uVar40 + 0xf;
  }
  else {
    if (uVar40 == (long)*dist_cache) {
      uVar41 = 0;
      goto LAB_0011290a;
    }
    uVar41 = 1;
    if (uVar40 != (long)dist_cache[1]) {
      uVar41 = (uVar40 + 3) - (long)*dist_cache;
      if (uVar41 < 7) {
        bVar16 = (byte)((int)uVar41 << 2);
        uVar34 = 0x9750468;
      }
      else {
        uVar41 = (uVar40 + 3) - (long)dist_cache[1];
        if (6 < uVar41) {
          uVar41 = 2;
          if ((uVar40 != (long)dist_cache[2]) && (uVar41 = 3, uVar40 != (long)dist_cache[3]))
          goto LAB_001128ce;
          goto LAB_001128d2;
        }
        bVar16 = (byte)((int)uVar41 << 2);
        uVar34 = 0xfdb1ace;
      }
      uVar41 = (ulong)(uVar34 >> (bVar16 & 0x1f) & 0xf);
    }
  }
LAB_001128d2:
  if ((uVar40 <= local_150) && (uVar41 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)uVar40;
  }
LAB_0011290a:
  uVar34 = (uint)local_120;
  local_b8->insert_len_ = uVar34;
  local_b8->copy_len_ = iVar26 << 0x19 | (uint)uVar48;
  uVar31 = (ulong)(params->dist).num_direct_distance_codes;
  uVar14 = uVar31 + 0x10;
  uVar27 = 0;
  if (uVar14 <= uVar41) {
    uVar43 = (params->dist).distance_postfix_bits;
    bVar16 = (byte)uVar43;
    uVar31 = ((4L << (bVar16 & 0x3f)) + (uVar41 - uVar31)) - 0x10;
    uVar37 = 0x1f;
    uVar28 = (uint)uVar31;
    if (uVar28 != 0) {
      for (; uVar28 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar37 = (uVar37 ^ 0xffffffe0) + 0x1f;
    uVar38 = (ulong)((uVar31 >> ((ulong)uVar37 & 0x3f) & 1) != 0);
    lVar50 = (ulong)uVar37 - (ulong)uVar43;
    uVar41 = (~(-1 << (bVar16 & 0x1f)) & uVar28) + uVar14 +
             (uVar38 + lVar50 * 2 + 0xfffe << (bVar16 & 0x3f)) | lVar50 * 0x400;
    uVar27 = (uint32_t)(uVar31 - (uVar38 + 2 << ((byte)uVar37 & 0x3f)) >> (bVar16 & 0x3f));
  }
  local_b8->dist_prefix_ = (uint16_t)uVar41;
  local_b8->dist_extra_ = uVar27;
  if (5 < local_120) {
    if (local_120 < 0x82) {
      uVar34 = 0x1f;
      uVar43 = (uint)(local_120 - 2);
      if (uVar43 != 0) {
        for (; uVar43 >> uVar34 == 0; uVar34 = uVar34 - 1) {
        }
      }
      uVar34 = (int)(local_120 - 2 >> ((char)(uVar34 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar34 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_120 < 0x842) {
      uVar43 = 0x1f;
      if (uVar34 - 0x42 != 0) {
        for (; uVar34 - 0x42 >> uVar43 == 0; uVar43 = uVar43 - 1) {
        }
      }
      uVar34 = (uVar43 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar34 = 0x15;
      if (0x1841 < local_120) {
        uVar34 = (uint)(ushort)(0x17 - (local_120 < 0x5842));
      }
    }
  }
  uVar43 = iVar26 + (uint)uVar48;
  if (uVar43 < 10) {
    uVar37 = uVar43 - 2;
  }
  else if (uVar43 < 0x86) {
    uVar43 = uVar43 - 6;
    uVar37 = 0x1f;
    if (uVar43 != 0) {
      for (; uVar43 >> uVar37 == 0; uVar37 = uVar37 - 1) {
      }
    }
    uVar37 = (uVar43 >> ((char)(uVar37 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar37 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar37 = 0x17;
    if (uVar43 < 0x846) {
      uVar37 = 0x1f;
      if (uVar43 - 0x46 != 0) {
        for (; uVar43 - 0x46 >> uVar37 == 0; uVar37 = uVar37 - 1) {
        }
      }
      uVar37 = (uVar37 ^ 0xffe0) + 0x2c;
    }
  }
  uVar6 = (ushort)uVar37;
  uVar35 = (uVar6 & 7) + ((ushort)uVar34 & 7) * 8;
  if ((((uVar41 & 0x3ff) == 0) && ((ushort)uVar34 < 8)) && (uVar6 < 0x10)) {
    if (7 < uVar6) {
      uVar35 = uVar35 + 0x40;
    }
  }
  else {
    iVar25 = ((uVar34 & 0xffff) >> 3) * 3 + ((uVar37 & 0xffff) >> 3);
    uVar35 = uVar35 + ((ushort)(0x520d40 >> ((char)iVar25 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar25 * 0x40 + 0x40;
  }
  local_b8->cmd_prefix_ = uVar35;
  *num_literals = *num_literals + local_120;
  position = uVar48 + uVar45;
  uVar14 = sVar19;
  if (position < sVar19) {
    uVar14 = position;
  }
  uVar31 = uVar45 + 2;
  if (uVar40 < uVar48 >> 2) {
    uVar41 = position + uVar40 * -4;
    if (uVar41 < uVar31) {
      uVar41 = uVar31;
    }
    uVar31 = uVar41;
    if (uVar14 < uVar41) {
      uVar31 = uVar14;
    }
  }
  uVar41 = uVar48 * 2 + uVar45 + lVar20;
  local_b8 = local_b8 + 1;
  for (; uVar31 < uVar14; uVar31 = uVar31 + 1) {
    uVar34 = (uint)(*(int *)(ringbuffer + (uVar31 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar32 = (ulong)uVar34;
    uVar6 = *(ushort *)(hasher + 0x80028);
    *(ushort *)(hasher + 0x80028) = uVar6 + 1;
    uVar38 = uVar31 - *(uint *)(hasher + uVar32 * 4 + 0x28);
    hasher[(uVar31 & 0xffff) + 0x30028] = (uint8_t)uVar34;
    if (0xfffe < uVar38) {
      uVar38 = 0xffff;
    }
    *(short *)(hasher + (ulong)uVar6 * 4 + 0x40028) = (short)uVar38;
    *(undefined2 *)(hasher + (ulong)uVar6 * 4 + 0x4002a) =
         *(undefined2 *)(hasher + uVar32 * 2 + 0x20028);
    *(int *)(hasher + uVar32 * 4 + 0x28) = (int)uVar31;
    *(ushort *)(hasher + uVar32 * 2 + 0x20028) = uVar6;
  }
  local_120 = 0;
  goto LAB_00111a9f;
code_r0x001124ad:
  lVar13 = lVar13 + -8;
  uVar38 = uVar38 + 1;
  goto LAB_00112494;
code_r0x00112352:
  lVar13 = lVar13 + -8;
  uVar46 = uVar46 + 1;
  goto LAB_00112339;
code_r0x00111f45:
  uVar42 = uVar42 + 8;
  goto LAB_00111f2a;
code_r0x00111d36:
  lVar13 = lVar13 + -8;
  uVar32 = uVar32 + 1;
  goto LAB_00111d16;
code_r0x00111ba6:
  lVar12 = lVar12 + -8;
  uVar36 = uVar36 + 1;
  goto LAB_00111b89;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}